

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

Kit_DsdMan_t * Kit_DsdManAlloc(int nVars,int nNodes)

{
  undefined4 uVar1;
  void *pvVar2;
  uint uVar3;
  Kit_DsdMan_t *pKVar4;
  void **ppvVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  CloudManager *pCVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  long lVar12;
  void **ppvVar13;
  int nWords;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  
  pKVar4 = (Kit_DsdMan_t *)malloc(0x30);
  pKVar4->nVars = 0;
  pKVar4->nWords = 0;
  pKVar4->vTtElems = (Vec_Ptr_t *)0x0;
  pKVar4->vTtNodes = (Vec_Ptr_t *)0x0;
  pKVar4->dd = (CloudManager *)0x0;
  pKVar4->vTtBdds = (Vec_Ptr_t *)0x0;
  pKVar4->vNodes = (Vec_Int_t *)0x0;
  pKVar4->nVars = nVars;
  uVar3 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar3 = 1;
  }
  pKVar4->nWords = uVar3;
  lVar16 = (long)(int)uVar3;
  lVar9 = lVar16 * 4 + 8;
  ppvVar5 = (void **)malloc(lVar9 * nVars);
  if (0 < nVars) {
    ppvVar6 = ppvVar5 + nVars;
    ppvVar13 = ppvVar5;
    uVar14 = (ulong)(uint)nVars;
    do {
      *ppvVar13 = ppvVar6;
      ppvVar13 = ppvVar13 + 1;
      ppvVar6 = (void **)((long)ppvVar6 + lVar16 * 4);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nSize = nVars;
  pVVar7->nCap = nVars;
  pVVar7->pArray = ppvVar5;
  if (0 < nVars) {
    uVar14 = 0;
    do {
      pvVar2 = ppvVar5[uVar14];
      if (uVar14 < 5) {
        if (0 < (int)uVar3) {
          uVar1 = (&DAT_00a05280)[uVar14];
          uVar15 = 0;
          do {
            *(undefined4 *)((long)pvVar2 + uVar15 * 4) = uVar1;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
      }
      else if (0 < (int)uVar3) {
        uVar15 = 0;
        do {
          *(uint *)((long)pvVar2 + uVar15 * 4) =
               -(uint)((1 << ((char)uVar14 - 5U & 0x1f) & (uint)uVar15) != 0);
          uVar15 = uVar15 + 1;
        } while (uVar3 != uVar15);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)nVars);
  }
  pKVar4->vTtElems = pVVar7;
  ppvVar5 = (void **)malloc(lVar9 * nNodes);
  if (0 < nNodes) {
    ppvVar6 = ppvVar5 + nNodes;
    uVar14 = (ulong)(uint)nNodes;
    ppvVar13 = ppvVar5;
    do {
      *ppvVar13 = ppvVar6;
      ppvVar13 = ppvVar13 + 1;
      ppvVar6 = (void **)((long)ppvVar6 + lVar16 * 4);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nSize = nNodes;
  pVVar7->nCap = nNodes;
  pVVar7->pArray = ppvVar5;
  pKVar4->vTtNodes = pVVar7;
  pCVar8 = Cloud_Init(0x10,0xe);
  pKVar4->dd = pCVar8;
  ppvVar5 = (void **)malloc(lVar9 * 0x1000);
  lVar9 = 0x8000;
  lVar12 = 0;
  do {
    ppvVar5[lVar12] = (void *)((long)ppvVar5 + lVar9);
    lVar12 = lVar12 + 1;
    lVar9 = lVar9 + lVar16 * 4;
  } while (lVar12 != 0x1000);
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x1000;
  pVVar7->nSize = 0x1000;
  pVVar7->pArray = ppvVar5;
  pKVar4->vTtBdds = pVVar7;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(0x800);
  pVVar10->pArray = piVar11;
  pKVar4->vNodes = pVVar10;
  return pKVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the DSD manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Kit_DsdMan_t * Kit_DsdManAlloc( int nVars, int nNodes )
{
    Kit_DsdMan_t * p;
    p = ABC_ALLOC( Kit_DsdMan_t, 1 );
    memset( p, 0, sizeof(Kit_DsdMan_t) );
    p->nVars    = nVars;
    p->nWords   = Kit_TruthWordNum( p->nVars );
    p->vTtElems = Vec_PtrAllocTruthTables( p->nVars );
    p->vTtNodes = Vec_PtrAllocSimInfo( nNodes, p->nWords );
    p->dd       = Cloud_Init( 16, 14 );
    p->vTtBdds  = Vec_PtrAllocSimInfo( (1<<12), p->nWords );
    p->vNodes   = Vec_IntAlloc( 512 );
    return p;
}